

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_generator_generate_blinded
              (secp256k1_context *ctx,secp256k1_generator *gen,uchar *key32,uchar *blind32)

{
  int iVar1;
  uchar *blind32_local;
  uchar *key32_local;
  secp256k1_generator *gen_local;
  secp256k1_context *ctx_local;
  
  if (gen == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"gen != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (key32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"key32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (blind32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"blind32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = secp256k1_generator_generate_internal(ctx,gen,key32,blind32);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_generator_generate_blinded(const secp256k1_context* ctx, secp256k1_generator* gen, const unsigned char *key32, const unsigned char *blind32) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(key32 != NULL);
    ARG_CHECK(blind32 != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    return secp256k1_generator_generate_internal(ctx, gen, key32, blind32);
}